

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrqfa.cc
# Opt level: O1

void predict_or_learn<false>(LRQFAstate *lrq,single_learner *base,example *ec)

{
  size_t *__s;
  features *this;
  float fVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint32_t uVar5;
  vw *pvVar6;
  vw *pvVar7;
  element_type *peVar8;
  size_type sVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar10;
  uint64_t *puVar11;
  byte *pbVar12;
  uint32_t *puVar13;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  weight *pwVar14;
  ostream *poVar15;
  char *pcVar16;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar17;
  byte *pbVar18;
  byte *pbVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  v_array<unsigned_char> *__range1;
  bool bVar23;
  char *new_feature;
  char *new_space;
  stringstream new_feature_buffer;
  ulong local_2a0;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  element_type local_240;
  sparse_parameters *local_200;
  ulong local_1f8;
  uint64_t local_1f0;
  ulong local_1e8;
  unsigned_long local_1e0;
  ulong local_1d8;
  long local_1d0;
  char *local_1c8;
  char *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pvVar6 = lrq->all;
  __s = lrq->orig_size;
  local_240.first.field_2._8_8_ = base;
  memset(__s,0,0x800);
  pbVar19 = (ec->super_example_predict).indices._end;
  for (pbVar12 = (ec->super_example_predict).indices._begin; pbVar12 != pbVar19;
      pbVar12 = (byte *)((long)pbVar12 + 1)) {
    bVar2 = *pbVar12;
    __s[bVar2] = (long)(ec->super_example_predict).feature_space[bVar2].values._end -
                 (long)(ec->super_example_predict).feature_space[bVar2].values._begin >> 2;
  }
  uVar4 = lrq->k;
  local_240.second._M_dataplus._M_p = (pointer)ec->example_counter;
  if ((double)uVar4 < 0.0) {
    sqrt((double)uVar4);
  }
  pvVar7 = lrq->all;
  puVar13 = &(pvVar7->weights).dense_weights._stride_shift;
  puVar11 = &(pvVar7->weights).dense_weights._weight_mask;
  if ((pvVar7->weights).sparse != false) {
    puVar13 = &(pvVar7->weights).sparse_weights._stride_shift;
    puVar11 = &(pvVar7->weights).sparse_weights._weight_mask;
  }
  local_240.first.field_2._M_allocated_capacity = (size_type)ec;
  if ((lrq->field_name)._M_string_length != 0) {
    local_1f0 = *puVar11;
    uVar5 = *puVar13;
    local_200 = &(pvVar6->weights).sparse_weights;
    pbVar12 = (byte *)(lrq->field_name)._M_dataplus._M_p;
    do {
      pbVar18 = pbVar12 + 1;
      pbVar19 = pbVar18;
      local_240.second._M_string_length = (size_type)pbVar12;
      if (pbVar18 !=
          (byte *)((lrq->field_name)._M_dataplus._M_p + (lrq->field_name)._M_string_length)) {
        do {
          bVar23 = ((ulong)local_240.second._M_dataplus._M_p & 1) == 0;
          pbVar12 = (byte *)local_240.second._M_string_length;
          if (bVar23) {
            pbVar12 = pbVar19;
          }
          bVar2 = *pbVar12;
          pbVar12 = pbVar19;
          if (bVar23) {
            pbVar12 = (byte *)local_240.second._M_string_length;
          }
          local_240.second.field_2._M_allocated_capacity = (size_type)pbVar19;
          if (__s[bVar2] != 0) {
            bVar3 = *pbVar12;
            local_240.second.field_2._8_8_ = (ec->super_example_predict).feature_space + bVar2;
            local_1e8 = (ulong)(lrq->field_id[bVar3] * uVar4);
            this = (ec->super_example_predict).feature_space + bVar3;
            local_1f8 = (ulong)(lrq->field_id[bVar2] * uVar4);
            this_01 = &(ec->super_example_predict).feature_space[bVar3].space_names;
            local_2a0 = 0;
            do {
              if (uVar4 != 0) {
                fVar1 = *(float *)(*(long *)local_240.second.field_2._8_8_ + local_2a0 * 4);
                local_1e0 = ((v_array<unsigned_long> *)(local_240.second.field_2._8_8_ + 0x20))->
                            _begin[local_2a0];
                uVar21 = 1;
                do {
                  iVar10 = (int)uVar21;
                  uVar22 = ((ulong)(uint)(iVar10 + (int)local_1e8) << ((byte)uVar5 & 0x3f)) +
                           local_1e0 & local_1f0;
                  if ((pvVar6->weights).sparse == true) {
                    pwVar14 = sparse_parameters::operator[](local_200,uVar22);
                  }
                  else {
                    pwVar14 = (pvVar6->weights).dense_weights._begin +
                              (uVar22 & (pvVar6->weights).dense_weights._weight_mask);
                  }
                  if (__s[bVar3] != 0) {
                    local_1d0 = (ulong)(uint)((int)local_1f8 + iVar10) << ((byte)uVar5 & 0x3f);
                    uVar22 = 0;
                    uVar20 = 1;
                    local_1d8 = uVar21;
                    do {
                      features::push_back(this,*pwVar14 * fVar1 * (this->values)._begin[uVar22],
                                          (this->indicies)._begin[uVar22] + local_1d0);
                      if ((pvVar6->audit != false) || (pvVar6->hash_inv == true)) {
                        std::__cxx11::stringstream::stringstream(local_1b8);
                        local_250.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._0_1_ = bVar3;
                        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,(char *)&local_250,1);
                        local_250.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._0_1_ = 0x5e;
                        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar15,(char *)&local_250,1);
                        peVar8 = this_01->_begin[uVar22].
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar15,(peVar8->second)._M_dataplus._M_p,
                                             (peVar8->second)._M_string_length);
                        local_250.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = (element_type *)
                                  CONCAT71(local_250.
                                           super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr._1_7_,0x5e);
                        poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar15,(char *)&local_250,1);
                        std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
                        local_1c0 = strdup("lrqfa");
                        std::__cxx11::stringbuf::str();
                        peVar8 = local_250.
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        pcVar16 = strdup((char *)local_250.
                                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr);
                        if (peVar8 != &local_240) {
                          operator_delete(peVar8);
                        }
                        local_1c8 = pcVar16;
                        this_02 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)operator_new(0x40);
                        std::
                        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::pair<char_*&,_char_*&,_true>(this_02,&local_1c0,&local_1c8);
                        local_250.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = this_02;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                        __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                                  (&local_250.
                                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,this_02);
                        v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::push_back(this_01,&local_250);
                        if (local_250.
                            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (local_250.
                                     super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
                        }
                        std::__cxx11::stringstream::~stringstream(local_1b8);
                        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                      }
                      bVar23 = uVar20 < __s[bVar3];
                      uVar22 = uVar20;
                      uVar20 = (ulong)((int)uVar20 + 1);
                    } while (bVar23);
                  }
                  uVar21 = (ulong)(iVar10 + 1U);
                } while (iVar10 + 1U <= uVar4);
              }
              local_2a0 = (ulong)((int)local_2a0 + 1);
            } while (local_2a0 < __s[bVar2]);
          }
          pbVar19 = (byte *)(local_240.second.field_2._M_allocated_capacity + 1);
        } while ((byte *)(local_240.second.field_2._M_allocated_capacity + 1) !=
                 (byte *)((lrq->field_name)._M_dataplus._M_p + (lrq->field_name)._M_string_length));
      }
      pbVar12 = pbVar18;
    } while (pbVar18 !=
             (byte *)((lrq->field_name)._M_dataplus._M_p + (lrq->field_name)._M_string_length));
  }
  (**(code **)(local_240.first.field_2._8_8_ + 0x30))
            (*(undefined8 *)(local_240.first.field_2._8_8_ + 0x18),
             *(undefined8 *)(local_240.first.field_2._8_8_ + 0x20),
             local_240.first.field_2._M_allocated_capacity);
  sVar9 = (lrq->field_name)._M_string_length;
  if (sVar9 != 0) {
    pbVar12 = (byte *)(lrq->field_name)._M_dataplus._M_p;
    pbVar19 = pbVar12 + sVar9;
    do {
      bVar2 = *pbVar12;
      (ec->super_example_predict).feature_space[bVar2].values._end =
           (ec->super_example_predict).feature_space[bVar2].values._begin + __s[bVar2];
      if ((pvVar6->audit != false) || (pvVar6->hash_inv == true)) {
        uVar21 = __s[bVar2];
        psVar17 = (ec->super_example_predict).feature_space[bVar2].space_names._begin;
        if (uVar21 < (ulong)((long)(ec->super_example_predict).feature_space[bVar2].space_names._end
                             - (long)psVar17 >> 4)) {
          uVar22 = uVar21 << 4 | 8;
          do {
            this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       ((long)&(psVar17->
                               super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + uVar22);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            uVar21 = uVar21 + 1;
            psVar17 = (ec->super_example_predict).feature_space[bVar2].space_names._begin;
            uVar22 = uVar22 + 0x10;
          } while (uVar21 < (ulong)((long)(ec->super_example_predict).feature_space[bVar2].
                                          space_names._end - (long)psVar17 >> 4));
        }
        (ec->super_example_predict).feature_space[bVar2].space_names._end = psVar17 + __s[bVar2];
      }
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar19);
  }
  return;
}

Assistant:

void predict_or_learn(LRQFAstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices) lrq.orig_size[i] = ec.feature_space[i].size();

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;
  unsigned int k = lrq.k;
  float sqrtk = (float)sqrt(k);

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  uint64_t weight_mask = lrq.all->weights.mask();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa

    for (string::const_iterator i1 = lrq.field_name.begin(); i1 != lrq.field_name.end(); ++i1)
    {
      for (string::const_iterator i2 = i1 + 1; i2 != lrq.field_name.end(); ++i2)
      {
        unsigned char left = (which % 2) ? *i1 : *i2;
        unsigned char right = ((which + 1) % 2) ? *i1 : *i2;
        unsigned int lfd_id = lrq.field_id[left];
        unsigned int rfd_id = lrq.field_id[right];
        for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
        {
          features& fs = ec.feature_space[left];
          float lfx = fs.values[lfn];
          uint64_t lindex = fs.indicies[lfn];
          for (unsigned int n = 1; n <= k; ++n)
          {
            uint64_t lwindex =
                (lindex + ((uint64_t)(rfd_id * k + n) << stride_shift));  // a feature has k weights in each field
            float* lw = &all.weights[lwindex & weight_mask];
            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex) * 0.5f / sqrtk;

            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              features& rfs = ec.feature_space[right];
              //                    feature* rf = ec.atomics[right].begin + rfn;
              // NB: ec.ft_offset added by base learner
              float rfx = rfs.values[rfn];
              uint64_t rindex = rfs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)(lfd_id * k + n) << stride_shift));

              rfs.push_back(*lw * lfx * rfx, rwindex);
              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << rfs.space_names[rfn].get()->second << '^' << n;
#ifdef _WIN32
                char* new_space = _strdup("lrqfa");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrqfa");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                rfs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
    }

    for (char i : lrq.field_name)
    {
      namespace_index right = i;
      features& rfs = ec.feature_space[right];
      rfs.values.end() = rfs.values.begin() + lrq.orig_size[right];

      if (all.audit || all.hash_inv)
      {
        for (size_t j = lrq.orig_size[right]; j < rfs.space_names.size(); ++j) rfs.space_names[j].~audit_strings_ptr();

        rfs.space_names.end() = rfs.space_names.begin() + lrq.orig_size[right];
      }
    }
  }
}